

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BailOut.cpp
# Opt level: O1

void BailOutRecord::UpdatePolymorphicFieldAccess
               (JavascriptFunction *function,BailOutRecord *bailOutRecord)

{
  code *pcVar1;
  bool bVar2;
  FunctionBody *this;
  DynamicProfileInfo *this_00;
  undefined4 *puVar3;
  PolymorphicInlineCache *pPVar4;
  
  if ((bailOutRecord->type & ~Branch) == Shared) {
    this = (FunctionBody *)bailOutRecord[1].globalBailOutRecordTable;
  }
  else {
    this = Js::JavascriptFunction::GetFunctionBody(function);
  }
  if ((this->dynamicProfileInfo).ptr != (DynamicProfileInfo *)0x0) {
    this_00 = Js::FunctionBody::GetAnyDynamicProfileInfo(this);
    if (this_00 == (DynamicProfileInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                         ,0x571,"(dynamicProfileInfo)","dynamicProfileInfo");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar3 = 0;
    }
    if (bailOutRecord->polymorphicCacheIndex != 0xffffffff) {
      Js::DynamicProfileInfo::RecordPolymorphicFieldAccess
                (this_00,this,bailOutRecord->polymorphicCacheIndex);
      bVar2 = IR::IsEquivalentTypeCheckBailOutKind(bailOutRecord->bailOutKind);
      if (bVar2) {
        pPVar4 = Js::FunctionBody::GetPolymorphicInlineCache
                           (this,bailOutRecord->polymorphicCacheIndex);
        if (pPVar4 != (PolymorphicInlineCache *)0x0) {
          pPVar4->ignoreForEquivalentObjTypeSpec = true;
        }
      }
    }
  }
  return;
}

Assistant:

void BailOutRecord::UpdatePolymorphicFieldAccess(Js::JavascriptFunction * function, BailOutRecord const * bailOutRecord)
{
    Js::FunctionBody * executeFunction = bailOutRecord->IsShared() ? ((SharedBailOutRecord*)bailOutRecord)->functionBody : function->GetFunctionBody();
    Js::DynamicProfileInfo *dynamicProfileInfo = nullptr;
    if (executeFunction->HasDynamicProfileInfo())
    {
        dynamicProfileInfo = executeFunction->GetAnyDynamicProfileInfo();
        Assert(dynamicProfileInfo);

        if (bailOutRecord->polymorphicCacheIndex != (uint)-1)
        {
            dynamicProfileInfo->RecordPolymorphicFieldAccess(executeFunction, bailOutRecord->polymorphicCacheIndex);
            if (IR::IsEquivalentTypeCheckBailOutKind(bailOutRecord->bailOutKind))
            {
                // If we've already got a polymorphic inline cache, and if we've got an equivalent type check
                // bailout here, make sure we don't try any more equivalent obj type spec using that cache.
                Js::PolymorphicInlineCache *polymorphicInlineCache = executeFunction->GetPolymorphicInlineCache(
                    bailOutRecord->polymorphicCacheIndex);
                if (polymorphicInlineCache)
                {
                    polymorphicInlineCache->SetIgnoreForEquivalentObjTypeSpec(true);
                }
            }
        }
    }
}